

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O0

void embree::os_free(void *ptr,size_t bytes,bool hugepages)

{
  int iVar1;
  bad_alloc *this;
  undefined8 uVar2;
  byte in_DL;
  long in_RSI;
  void *in_RDI;
  size_t pageSize;
  
  if (in_RSI != 0) {
    iVar1 = 0x1000;
    if ((in_DL & 1) != 0) {
      iVar1 = 0x200000;
    }
    this = (bad_alloc *)(long)iVar1;
    iVar1 = munmap(in_RDI,(ulong)(this + in_RSI + -1) & ((ulong)(this + -1) ^ 0xffffffffffffffff));
    if (iVar1 == -1) {
      uVar2 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this);
      __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

void os_free(void* ptr, size_t bytes, bool hugepages) 
  {
    if (bytes == 0)
      return;

    /* for hugepages we need to also align the size */
    const size_t pageSize = hugepages ? PAGE_SIZE_2M : PAGE_SIZE_4K;
    bytes = (bytes+pageSize-1) & ~(pageSize-1);
    if (munmap(ptr,bytes) == -1)
      throw std::bad_alloc();
  }